

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_yuv_rgb.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  uint8_t *v;
  uint8_t *rgb;
  int iVar3;
  uint uVar4;
  code *yuv2rgb_fun;
  ulong uVar5;
  uint8_t *puVar6;
  uint uVar7;
  ulong uVar8;
  undefined4 uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  uint8_t *puVar14;
  int iVar15;
  uint32_t uVar16;
  ulong uVar17;
  uint8_t *puVar18;
  long lVar19;
  uint8_t *puVar20;
  ulong uVar21;
  uint32_t uv_stride;
  uint32_t uVar22;
  uint32_t height;
  uint32_t width;
  uint8_t *local_f8;
  uint8_t *local_f0;
  uint8_t *local_e8;
  uint8_t *local_e0;
  uint8_t *local_d8;
  uint8_t *local_d0;
  uint8_t *local_c8;
  uint8_t *local_c0;
  undefined4 local_b4;
  uint8_t *local_b0;
  char *local_a8;
  ulong local_a0;
  uint8_t *local_98;
  ulong local_90;
  uint8_t *local_88;
  uint8_t *local_80;
  ulong local_78;
  ulong local_70;
  uint8_t *local_68;
  undefined4 local_5c;
  uint8_t *local_58;
  uint8_t *RGBA;
  uint8_t *local_48;
  ulong local_40;
  ulong local_38;
  
  if (argc < 4) {
    puts(
        "Usage : test yuv2rgb <yuv image file> <image width> <image height> <output template filename>"
        );
    puts(
        "Or    : test yuv2rgb_nv12 <yuv image file> <image width> <image height> <output template filename>"
        );
    puts(
        "Or    : test yuv2rgb_nv21 <yuv image file> <image width> <image height> <output template filename>"
        );
    puts("Or    : test rgb2yuv <rgb24 binary ppm image file> <output template filename>");
    pcVar13 = "Or    : test rgba2yuv <rgb24 binary ppm image file> <output template filename>";
    goto LAB_0010338c;
  }
  printf("Time will be measured in each configuration for %d iterations...\n",100);
  pcVar13 = argv[1];
  iVar3 = strcmp(pcVar13,"yuv2rgb");
  local_c8 = (uint8_t *)CONCAT44(local_c8._4_4_,iVar3);
  if (iVar3 == 0) {
    if ((uint)argc < 6) {
      pcVar13 = "Invalid argument number for yuv2rgb mode, call without argument to see usage.";
      goto LAB_0010338c;
    }
    local_b4 = 0;
LAB_00102cda:
    uVar9 = 0;
  }
  else {
    iVar3 = strcmp(pcVar13,"yuv2rgb_nv12");
    if (iVar3 == 0) {
      local_b4 = 1;
      goto LAB_00102cda;
    }
    iVar3 = strcmp(pcVar13,"yuv2rgb_nv21");
    if (iVar3 != 0) {
      iVar3 = strcmp(pcVar13,"rgb2yuv");
      if (iVar3 == 0) {
        local_98 = (uint8_t *)0x0;
        puVar20 = (uint8_t *)argv[3];
        iVar3 = readPPM(argv[2],&width,&height,&local_98);
        uVar22 = width;
        uVar16 = height;
        if (iVar3 == 0) {
          uVar10 = (ulong)height;
          uVar7 = height * width;
          puVar18 = (uint8_t *)malloc((ulong)(uVar7 * 3 >> 1));
          uVar4 = uVar22 + 1 >> 1;
          local_d8 = (uint8_t *)(ulong)((uVar16 + 1 >> 1) * uVar4);
          local_c8 = (uint8_t *)(ulong)((-uVar22 & 0xf) + uVar22);
          local_f0 = (uint8_t *)(ulong)((-uVar4 & 0xf) + uVar4);
          uVar4 = (uVar22 * -3 & 0xf) + uVar22 * 3;
          local_88 = puVar18;
          iVar3 = posix_memalign(&local_d0,0x10,uVar10 * uVar4);
          puVar6 = local_98;
          uVar10 = 0;
          if (iVar3 == 0) {
            local_f8 = local_d0;
          }
          else {
            local_f8 = (uint8_t *)0x0;
          }
          puVar14 = puVar18 + uVar7;
          local_e8 = puVar20;
          local_e0 = puVar18;
          if (height != 0) {
            iVar3 = 0;
            uVar8 = 0;
            puVar20 = local_f8;
            local_c0 = puVar18 + uVar7;
            do {
              memcpy(puVar20,puVar6 + iVar3 * width,(ulong)(width * 3));
              uVar8 = uVar8 + 1;
              uVar10 = (ulong)height;
              iVar3 = iVar3 + 3;
              puVar20 = puVar20 + uVar4;
              puVar14 = local_c0;
            } while (uVar8 < uVar10);
          }
          local_d8 = puVar14 + (long)local_d8;
          lVar11 = uVar10 * (long)local_c8;
          lVar19 = (ulong)((int)uVar10 + 1U >> 1) * (long)local_f0;
          iVar3 = posix_memalign(&local_d0,0x10,lVar19 * 2 + lVar11);
          puVar20 = local_d8;
          if (iVar3 != 0) {
            local_d0 = (uint8_t *)0x0;
          }
          local_b0 = local_d0;
          test_rgb2yuv(width,height,puVar6,width * 3,local_e0,puVar14,local_d8,width,width + 1 >> 1,
                       YCBCR_601,(char *)local_e8,"std",100,rgb24_yuv420_std);
          puVar18 = local_e8;
          test_rgb2yuv(width,height,puVar6,width * 3,local_e0,puVar14,puVar20,width,width + 1 >> 1,
                       YCBCR_601,(char *)local_e8,"sse2_unaligned",100,rgb24_yuv420_sseu);
          puVar6 = local_b0;
          puVar20 = local_f8;
          test_rgb2yuv(width,height,local_f8,uVar4,local_b0,local_d0 + lVar11,
                       local_d0 + lVar11 + lVar19,(uint32_t)local_c8,(uint32_t)local_f0,YCBCR_601,
                       (char *)puVar18,"sse2_aligned",100,rgb24_yuv420_sse);
          goto LAB_00103333;
        }
      }
      else {
        iVar3 = strcmp(pcVar13,"rgba2yuv");
        if (iVar3 != 0) {
          pcVar13 = "Invalid mode, call without argument to see usage.";
          goto LAB_0010338c;
        }
        local_98 = (uint8_t *)0x0;
        puVar20 = (uint8_t *)argv[3];
        iVar3 = readPPM(argv[2],&width,&height,&local_98);
        if (iVar3 == 0) {
          uVar10 = 0;
          RGBA = (uint8_t *)0x0;
          convert_rgb_to_rgba(local_98,width,height,&RGBA);
          uVar22 = width;
          uVar16 = height;
          uVar8 = (ulong)height;
          uVar7 = height * width;
          local_e8 = (uint8_t *)malloc((ulong)(uVar7 * 3 >> 1));
          uVar4 = uVar22 + 1 >> 1;
          uVar5 = (ulong)((uVar16 + 1 >> 1) * uVar4);
          local_d8 = (uint8_t *)(ulong)((-uVar22 & 0xf) + uVar22);
          local_e0 = (uint8_t *)(ulong)((-uVar4 & 0xf) + uVar4);
          uVar4 = (uVar22 * -4 & 0xc) + uVar22 * 4;
          local_88 = local_e8;
          iVar3 = posix_memalign(&local_d0,0x10,uVar8 * uVar4);
          puVar6 = RGBA;
          puVar18 = (uint8_t *)0x0;
          if (iVar3 == 0) {
            puVar18 = local_d0;
          }
          puVar14 = local_e8 + uVar7;
          local_c8 = (uint8_t *)uVar5;
          local_f8 = puVar18;
          local_f0 = puVar20;
          if (height != 0) {
            iVar3 = 0;
            uVar8 = 0;
            local_c0 = local_e8 + uVar7;
            do {
              memcpy(puVar18,puVar6 + iVar3 * width,(ulong)(width << 2));
              uVar8 = uVar8 + 1;
              uVar10 = (ulong)height;
              iVar3 = iVar3 + 4;
              puVar18 = puVar18 + uVar4;
              puVar14 = local_c0;
            } while (uVar8 < uVar10);
          }
          local_c8 = puVar14 + (long)local_c8;
          lVar19 = uVar10 * (long)local_d8;
          lVar11 = (ulong)((int)uVar10 + 1U >> 1) * (long)local_e0;
          iVar3 = posix_memalign(&local_d0,0x10,lVar11 * 2 + lVar19);
          puVar20 = local_c8;
          if (iVar3 != 0) {
            local_d0 = (uint8_t *)0x0;
          }
          local_b0 = local_d0;
          test_rgb2yuv(width,height,puVar6,width * 4,local_e8,puVar14,local_c8,width,width + 1 >> 1,
                       YCBCR_601,(char *)local_f0,"std",100,rgb32_yuv420_std);
          puVar18 = local_f0;
          test_rgb2yuv(width,height,puVar6,width * 4,local_e8,puVar14,puVar20,width,width + 1 >> 1,
                       YCBCR_601,(char *)local_f0,"sse2_unaligned",100,rgb32_yuv420_sseu);
          puVar6 = local_b0;
          puVar20 = local_f8;
          test_rgb2yuv(width,height,local_f8,uVar4,local_b0,local_d0 + lVar19,
                       local_d0 + lVar19 + lVar11,(uint32_t)local_d8,(uint32_t)local_e0,YCBCR_601,
                       (char *)puVar18,"sse2_aligned",100,rgb32_yuv420_sse);
          free(RGBA);
          goto LAB_00103333;
        }
      }
      pcVar13 = "Error reading image file, check that the file exists and has the correct format.";
      goto LAB_0010338c;
    }
    uVar9 = (undefined4)CONCAT71((uint7)(uint3)((uint)argc >> 8),1);
    local_b4 = 0;
  }
  pcVar13 = argv[2];
  local_88 = (uint8_t *)0x0;
  uVar4 = atoi(argv[3]);
  uVar10 = (ulong)uVar4;
  width = uVar4;
  uVar7 = atoi(argv[4]);
  uVar8 = (ulong)uVar7;
  pcVar1 = argv[5];
  height = uVar7;
  iVar3 = readRawYUV(pcVar13,uVar4,uVar7,&local_88);
  if (iVar3 != 0) {
    pcVar13 = 
    "Error reading image file, check that the file exists and has the correct format and resolution."
    ;
LAB_0010338c:
    puts(pcVar13);
    return 1;
  }
  uVar2 = uVar4 * 3;
  local_a8 = pcVar1;
  local_5c = uVar9;
  local_98 = (uint8_t *)malloc((ulong)(uVar2 * uVar7));
  puVar18 = local_88;
  local_f0 = local_88 + uVar7 * uVar4;
  uVar12 = uVar4 + 1 >> 1;
  local_70 = (ulong)uVar12;
  uVar7 = uVar7 + 1 >> 1;
  local_c0 = (uint8_t *)(ulong)(uVar7 * uVar12);
  local_e8 = (uint8_t *)(ulong)((-uVar4 & 0xf) + uVar4);
  local_58 = (uint8_t *)(ulong)((-uVar12 & 0xf) + uVar12);
  local_68 = local_e8;
  if ((int)local_c8 == 0) {
    local_68 = local_58;
  }
  local_90 = (ulong)((uVar4 * -3 & 0xf) + uVar2);
  lVar11 = (long)local_e8 * uVar8;
  local_68 = (uint8_t *)((ulong)uVar7 * (long)local_68);
  local_a0 = uVar8;
  local_80 = local_98;
  local_78 = (ulong)uVar2;
  iVar3 = posix_memalign(&local_d0,0x10,lVar11 + (long)local_68 * 2);
  uVar5 = 0;
  puVar20 = (uint8_t *)0x0;
  if (iVar3 == 0) {
    puVar20 = local_d0;
  }
  local_c0 = local_f0 + (long)local_c0;
  local_d8 = puVar20 + lVar11;
  local_68 = local_d8 + (long)local_68;
  local_e0 = puVar18;
  local_b0 = puVar20;
  if ((int)local_a0 != 0) {
    local_f8 = (uint8_t *)(ulong)uVar4;
    local_48 = (uint8_t *)(local_70 & 0xffffffff);
    uVar17 = 0;
    uVar21 = 0;
    uVar5 = uVar8;
    local_40 = uVar8;
    local_38 = uVar10;
    do {
      memcpy(puVar20,puVar18 + uVar17,(size_t)local_f8);
      if ((uVar21 & 1) == 0) {
        uVar8 = uVar21 >> 1 & 0x7fffffff;
        iVar3 = (int)uVar8;
        if ((int)local_c8 == 0) {
          lVar11 = uVar8 * (long)local_58;
          iVar15 = (int)local_70;
          memcpy(local_d8 + lVar11,local_f0 + (uint)(iVar15 * iVar3),local_70);
          puVar14 = local_68 + lVar11;
          puVar18 = local_c0 + (uint)(iVar15 * iVar3);
          puVar6 = local_48;
          uVar5 = local_40;
          uVar10 = local_38;
        }
        else {
          puVar14 = local_d8 + uVar8 * (long)local_e8;
          puVar18 = local_f0 + (uint)((int)uVar10 * iVar3);
          puVar6 = local_f8;
        }
        memcpy(puVar14,puVar18,(size_t)puVar6);
        puVar18 = local_e0;
      }
      uVar21 = uVar21 + 1;
      uVar4 = (uint)uVar10;
      uVar17 = (ulong)((int)uVar17 + uVar4);
      puVar20 = puVar20 + (long)local_e8;
    } while (uVar21 < uVar5);
  }
  puVar6 = local_b0;
  iVar3 = posix_memalign(&local_d0,0x10,uVar5 * local_90);
  rgb = local_80;
  v = local_c0;
  puVar14 = local_f0;
  puVar20 = local_d0;
  if (iVar3 != 0) {
    puVar20 = (uint8_t *)0x0;
  }
  uVar16 = (uint32_t)local_a0;
  uVar22 = (uint32_t)local_78;
  if ((int)local_c8 == 0) {
    uv_stride = (uint32_t)local_70;
    local_f8 = puVar20;
    test_yuv2rgb(uVar4,uVar16,puVar18,local_f0,local_c0,uVar4,uv_stride,local_80,uVar22,YCBCR_601,
                 local_a8,"std",100,yuv420_rgb24_std);
    pcVar13 = local_a8;
    puVar6 = local_b0;
    puVar20 = local_f8;
    test_yuv2rgb(uVar4,(uint32_t)local_a0,local_e0,puVar14,v,uVar4,uv_stride,rgb,uVar22,YCBCR_601,
                 local_a8,"sse2_unaligned",100,yuv420_rgb24_sseu);
    test_yuv2rgb(uVar4,(uint32_t)local_a0,puVar6,local_d8,local_68,(uint32_t)local_e8,
                 (uint32_t)local_58,puVar20,(uint32_t)local_90,YCBCR_601,pcVar13,"sse2_aligned",100,
                 yuv420_rgb24_sse);
  }
  else {
    if ((char)local_b4 == '\0') {
      if ((char)local_5c == '\0') goto LAB_00103333;
      local_f8 = puVar20;
      test_yuvsp2rgb(uVar4,uVar16,puVar18,local_f0,uVar4,uVar4,local_80,uVar22,YCBCR_601,local_a8,
                     "std",100,nv21_rgb24_std);
      pcVar13 = local_a8;
      puVar20 = local_f8;
      test_yuvsp2rgb(uVar4,uVar16,local_e0,puVar14,uVar4,uVar4,rgb,uVar22,YCBCR_601,local_a8,
                     "sse2_unaligned",100,nv21_rgb24_sseu);
      yuv2rgb_fun = nv21_rgb24_sse;
    }
    else {
      local_f8 = puVar20;
      test_yuvsp2rgb(uVar4,uVar16,puVar18,local_f0,uVar4,uVar4,local_80,uVar22,YCBCR_601,local_a8,
                     "std",100,nv12_rgb24_std);
      pcVar13 = local_a8;
      puVar20 = local_f8;
      test_yuvsp2rgb(uVar4,uVar16,local_e0,puVar14,uVar4,uVar4,rgb,uVar22,YCBCR_601,local_a8,
                     "sse2_unaligned",100,nv12_rgb24_sseu);
      yuv2rgb_fun = nv12_rgb24_sse;
    }
    test_yuvsp2rgb(uVar4,uVar16,puVar6,local_d8,(uint32_t)local_e8,(uint32_t)local_e8,puVar20,
                   (uint32_t)local_90,YCBCR_601,pcVar13,"sse2_aligned",100,yuv2rgb_fun);
  }
LAB_00103333:
  free(puVar20);
  free(puVar6);
  free(local_98);
  free(local_88);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	if(argc<4)
	{
		printf("Usage : test yuv2rgb <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test yuv2rgb_nv12 <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test yuv2rgb_nv21 <yuv image file> <image width> <image height> <output template filename>\n");
		printf("Or    : test rgb2yuv <rgb24 binary ppm image file> <output template filename>\n");
		printf("Or    : test rgba2yuv <rgb24 binary ppm image file> <output template filename>\n");
		return 1;
	}
	
	const int iteration_number = 100;
	printf("Time will be measured in each configuration for %d iterations...\n", iteration_number);
	const YCbCrType yuv_format = YCBCR_601;
	//const YCbCrType yuv_format = YCBCR_709;
	//const YCbCrType yuv_format = YCBCR_JPEG;
	
	Mode mode;
	if(strcmp(argv[1], "yuv2rgb")==0)
	{
		mode=YUV2RGB;
		if(argc<6)
		{
			printf("Invalid argument number for yuv2rgb mode, call without argument to see usage.\n");
			return 1;
		}
	}
	else if(strcmp(argv[1], "yuv2rgb_nv12")==0)
	{
		mode=YUV2RGB_NV12;
	}
	else if(strcmp(argv[1], "yuv2rgb_nv21")==0)
	{
		mode=YUV2RGB_NV21;
	}
	else if(strcmp(argv[1], "rgb2yuv")==0)
	{
		mode=RGB2YUV;
	}
	else if(strcmp(argv[1], "rgba2yuv")==0)
	{
		mode=RGBA2YUV;
	}
	else
	{
		printf("Invalid mode, call without argument to see usage.\n");
		return 1;
	}
	
	const char *filename = argv[2];
	uint32_t width, height;
	const char *out;
	uint8_t *YUV=NULL, *RGB=NULL, *Y=NULL, *U=NULL, *V=NULL, *RGBa=NULL, *YUVa=NULL, *Ya=NULL, *Ua=NULL, *Va=NULL;
	
	if(mode==YUV2RGB || mode==YUV2RGB_NV12 ||  mode==YUV2RGB_NV21)
	{
		//parse argument line
		width = atoi(argv[3]);
		height = atoi(argv[4]);
		out = argv[5];
		
		// read input data and allocate output data
		if(readRawYUV(filename, width, height, &YUV)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format and resolution.\n");
			return 1;
		}
		
#if USE_FFMPEG
		yuv2rgb_swscale_ctx = sws_getContext(width, height, AV_PIX_FMT_YUV420P, width, height, AV_PIX_FMT_RGB24, 0, 0, 0, 0);
#endif
		
		RGB = malloc(3*width*height);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16;
		const size_t uv_stride = (mode==YUV2RGB) ? (width+1)/2 + (16-((width+1)/2)%16)%16 : y_stride;
		const size_t rgb_stride = width*3 +(16-(3*width)%16)%16;
	
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(Ya+i*y_stride, Y+i*width, width);
			if((i%2)==0)
			{
				if(mode==YUV2RGB)
				{
					memcpy(Ua+(i/2)*uv_stride, U+(i/2)*((width+1)/2), (width+1)/2);
					memcpy(Va+(i/2)*uv_stride, V+(i/2)*((width+1)/2), (width+1)/2);
				}
				else
				{
					memcpy(Ua+(i/2)*uv_stride, U+(i/2)*width, width);
				}
			}
		}
		
		RGBa = _mm_malloc(rgb_stride*height, 16);
		
		// test all versions
		if(mode==YUV2RGB)
		{
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "std", iteration_number, yuv420_rgb24_std);
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, yuv420_rgb24_sseu);
#if USE_FFMPEG
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "ffmpeg_unaligned", iteration_number, yuv420_rgb24_ffmpeg);
#endif
#if USE_IPP
			test_yuv2rgb(width, height, Y, U, V, width, (width+1)/2, RGB, width*3, yuv_format, 
				out, "ipp_unaligned", iteration_number, yuv420_rgb24_ipp);
#endif
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, yuv420_rgb24_sse);
#if USE_FFMPEG
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "ffmpeg_aligned", iteration_number, yuv420_rgb24_ffmpeg);
#endif
#if USE_IPP
			test_yuv2rgb(width, height, Ya, Ua, Va, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "ipp_aligned", iteration_number, yuv420_rgb24_ipp);
#endif
		}
		else if(mode==YUV2RGB_NV12)
		{
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "std", iteration_number, nv12_rgb24_std);
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, nv12_rgb24_sseu);
			test_yuvsp2rgb(width, height, Ya, Ua, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, nv12_rgb24_sse);
		}
		else if(mode==YUV2RGB_NV21)
		{
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "std", iteration_number, nv21_rgb24_std);
			test_yuvsp2rgb(width, height, Y, U, width, width, RGB, width*3, yuv_format, 
				out, "sse2_unaligned", iteration_number, nv21_rgb24_sseu);
			test_yuvsp2rgb(width, height, Ya, Ua, y_stride, uv_stride, RGBa, rgb_stride, yuv_format, 
				out, "sse2_aligned", iteration_number, nv21_rgb24_sse);
		}
	}
	else if(mode==RGB2YUV)
	{
		//parse argument line
		out = argv[3];
		
		// read input data and allocate output data
		if(readPPM(filename, &width, &height, &RGB)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format.\n");
			return 1;
		}
		
#if USE_FFMPEG
		rgb2yuv_swscale_ctx = sws_getContext(width, height, AV_PIX_FMT_RGB24, width, height, AV_PIX_FMT_YUV420P, 0, 0, 0, 0);
#endif
		
		YUV = malloc(width*height*3/2);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16,
		uv_stride = (width+1)/2 + (16-((width+1)/2)%16)%16,
		rgb_stride = width*3 +(16-(3*width)%16)%16;
		
		RGBa = _mm_malloc(rgb_stride*height, 16);
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(RGBa+i*rgb_stride, RGB+i*width*3, width*3);
		}
		
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;

		
		// test all versions
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "std", iteration_number, rgb24_yuv420_std);
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "sse2_unaligned", iteration_number, rgb24_yuv420_sseu);
#if USE_FFMPEG
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "ffmpeg_unaligned", iteration_number, rgb24_yuv420_ffmpeg);
#endif
#if USE_IPP
		test_rgb2yuv(width, height, RGB, width*3, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "ipp_unaligned", iteration_number, rgb24_yuv420_ipp);
#endif
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "sse2_aligned", iteration_number, rgb24_yuv420_sse);
#if USE_FFMPEG
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "ffmpeg_aligned", iteration_number, rgb24_yuv420_ffmpeg);
#endif
#if USE_IPP
		test_rgb2yuv(width, height, RGBa, rgb_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "ipp_aligned", iteration_number, rgb24_yuv420_ipp);
#endif
	}
	else if(mode==RGBA2YUV)
	{
		//parse argument line
		out = argv[3];
		
		// read input data and allocate output data
		if(readPPM(filename, &width, &height, &RGB)!=0)
		{
			printf("Error reading image file, check that the file exists and has the correct format.\n");
			return 1;
		}
		// convert rgb to rgba
		uint8_t *RGBA = NULL;
		convert_rgb_to_rgba(RGB, width, height, &RGBA);
		
		YUV = malloc(width*height*3/2);
		
		Y = YUV;
		U = YUV+width*height;
		V = YUV+width*height+((width+1)/2)*((height+1)/2);
		
		// allocate aligned data
		const size_t y_stride = width + (16-width%16)%16,
		uv_stride = (width+1)/2 + (16-((width+1)/2)%16)%16,
		rgba_stride = width*4 +(16-(4*width)%16)%16;
		
		RGBa = _mm_malloc(rgba_stride*height, 16);
		for(unsigned int i=0; i<height; ++i)
		{
			memcpy(RGBa+i*rgba_stride, RGBA+i*width*4, width*4);
		}
		
		const size_t y_size = y_stride*height, uv_size = uv_stride*((height+1)/2);
		YUVa = _mm_malloc(y_size+2*uv_size, 16);
		Ya = YUVa;
		Ua = YUVa+y_size;
		Va = YUVa+y_size+uv_size;
		
		// test all versions
		test_rgb2yuv(width, height, RGBA, width*4, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "std", iteration_number, rgb32_yuv420_std);
		test_rgb2yuv(width, height, RGBA, width*4, Y, U, V, width, (width+1)/2, yuv_format, 
			out, "sse2_unaligned", iteration_number, rgb32_yuv420_sseu);
		test_rgb2yuv(width, height, RGBa, rgba_stride, Ya, Ua, Va, y_stride, uv_stride, yuv_format, 
			out, "sse2_aligned", iteration_number, rgb32_yuv420_sse);
		
		free(RGBA);
	}
	
	_mm_free(RGBa);
	_mm_free(YUVa);
	free(RGB);
	free(YUV);
	
	return 0;
}